

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

UdpDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::UdpPortListSyntax&,slang::syntax::UdpBodySyntax&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,UdpPortListSyntax *args_3,UdpBodySyntax *args_4,Token *args_5,
          NamedBlockClauseSyntax **args_6)

{
  Token primitive;
  Token name;
  Token endprimitive;
  UdpDeclarationSyntax *this_00;
  
  this_00 = (UdpDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UdpDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (UdpDeclarationSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  primitive.kind = args_1->kind;
  primitive._2_1_ = args_1->field_0x2;
  primitive.numFlags.raw = (args_1->numFlags).raw;
  primitive.rawLen = args_1->rawLen;
  primitive.info = args_1->info;
  name.kind = args_2->kind;
  name._2_1_ = args_2->field_0x2;
  name.numFlags.raw = (args_2->numFlags).raw;
  name.rawLen = args_2->rawLen;
  name.info = args_2->info;
  endprimitive.kind = args_5->kind;
  endprimitive._2_1_ = args_5->field_0x2;
  endprimitive.numFlags.raw = (args_5->numFlags).raw;
  endprimitive.rawLen = args_5->rawLen;
  endprimitive.info = args_5->info;
  slang::syntax::UdpDeclarationSyntax::UdpDeclarationSyntax
            (this_00,args,primitive,name,args_3,args_4,endprimitive,*args_6);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }